

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

Vector3d * __thiscall VCCluster::center(VCCluster *this)

{
  Scalar *in_RSI;
  Vector3d *in_RDI;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffffc8;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffffd0;
  
  if ((in_RSI[0xb] != 0.0) || (NAN(in_RSI[0xb]))) {
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator/
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffffc8,in_RSI
              );
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)0x0,(Scalar *)0x0,
               (Scalar *)in_stack_ffffffffffffffd0,(Scalar *)in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

Vector3d VCCluster::center() {
	if (area == 0)
		return Vector3d(0,0,0);
	return weightedSum / area;
}